

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

void TransformDC_C(int16_t *in,uint8_t *dst)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  ulong uVar9;
  undefined1 auVar10 [13];
  long lVar11;
  int iVar12;
  undefined1 auVar13 [16];
  
  iVar12 = *in + 4 >> 3;
  lVar11 = 0;
  do {
    uVar1 = *(undefined4 *)(dst + lVar11);
    uVar9 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar6._8_4_ = 0;
    auVar6._0_8_ = uVar9;
    auVar6[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar7[8] = (char)((uint)uVar1 >> 0x10);
    auVar7._0_8_ = uVar9;
    auVar7[9] = 0;
    auVar7._10_3_ = auVar6._10_3_;
    auVar10._5_8_ = 0;
    auVar10._0_5_ = auVar7._8_5_;
    auVar8[4] = (char)((uint)uVar1 >> 8);
    auVar8._0_4_ = (int)uVar9;
    auVar8[5] = 0;
    auVar8._6_7_ = SUB137(auVar10 << 0x40,6);
    auVar13._0_4_ = (int)uVar9 + iVar12;
    auVar13._4_4_ = auVar8._4_4_ + iVar12;
    auVar13._8_4_ = auVar7._8_4_ + iVar12;
    auVar13._12_4_ = (uint)(uint3)(auVar6._10_3_ >> 0x10) + iVar12;
    auVar13 = packssdw(auVar13,auVar13);
    sVar2 = auVar13._0_2_;
    sVar3 = auVar13._2_2_;
    sVar4 = auVar13._4_2_;
    sVar5 = auVar13._6_2_;
    *(uint *)(dst + lVar11) =
         CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar13[6] - (0xff < sVar5),
                  CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar13[4] - (0xff < sVar4),
                           CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar13[2] - (0xff < sVar3),
                                    (0 < sVar2) * (sVar2 < 0x100) * auVar13[0] - (0xff < sVar2))));
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0x80);
  return;
}

Assistant:

static void TransformDC_C(const int16_t* WEBP_RESTRICT in,
                          uint8_t* WEBP_RESTRICT dst) {
  const int DC = in[0] + 4;
  int i, j;
  for (j = 0; j < 4; ++j) {
    for (i = 0; i < 4; ++i) {
      STORE(i, j, DC);
    }
  }
}